

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_cat.cc
# Opt level: O0

string * absl::StrCat_abi_cxx11_(AlphaNum *a,AlphaNum *b,AlphaNum *c)

{
  Nonnull<char_*> out_00;
  AlphaNum *x;
  Nonnull<char_*> pcVar1;
  long lVar2;
  string *in_RDI;
  char *out;
  char *begin;
  char *absl_raw_log_internal_filename;
  string death_message;
  uint64_t result_size;
  uint64_t kMaxSize;
  string *result;
  size_t in_stack_fffffffffffffed8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee0;
  AlphaNum *in_stack_fffffffffffffef8;
  
  std::__cxx11::string::string((string *)in_RDI);
  AlphaNum::size((AlphaNum *)0x3a444a);
  AlphaNum::size((AlphaNum *)0x3a445e);
  AlphaNum::size((AlphaNum *)0x3a4484);
  strings_internal::STLStringResizeUninitialized<std::__cxx11::string,void>
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  out_00 = (Nonnull<char_*>)std::__cxx11::string::operator[]((ulong)in_RDI);
  pcVar1 = out_00;
  x = (AlphaNum *)anon_unknown_5::Append(out_00,in_stack_fffffffffffffef8);
  anon_unknown_5::Append(pcVar1,x);
  pcVar1 = anon_unknown_5::Append(pcVar1,x);
  lVar2 = std::__cxx11::string::size();
  if (pcVar1 == out_00 + lVar2) {
    return in_RDI;
  }
  __assert_fail("out == begin + result.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/str_cat.cc"
                ,0x61,
                "std::string absl::StrCat(const AlphaNum &, const AlphaNum &, const AlphaNum &)");
}

Assistant:

std::string StrCat(const AlphaNum& a, const AlphaNum& b, const AlphaNum& c) {
  std::string result;
  // Use uint64_t to prevent size_t overflow. We assume it is not possible for
  // in memory strings to overflow a uint64_t.
  constexpr uint64_t kMaxSize = uint64_t{std::numeric_limits<size_t>::max()};
  const uint64_t result_size = static_cast<uint64_t>(a.size()) +
                               static_cast<uint64_t>(b.size()) +
                               static_cast<uint64_t>(c.size());
  ABSL_INTERNAL_CHECK(result_size <= kMaxSize, "size_t overflow");
  strings_internal::STLStringResizeUninitialized(
      &result, static_cast<size_t>(result_size));
  char* const begin = &result[0];
  char* out = begin;
  out = Append(out, a);
  out = Append(out, b);
  out = Append(out, c);
  assert(out == begin + result.size());
  return result;
}